

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O0

string * __thiscall cppcms::http::cookie::name_abi_cxx11_(cookie *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string cookie::name() const { return name_; }